

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::register_control_dependent_expression(CompilerGLSL *this,uint32_t expr)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  SPIRBlock *pSVar3;
  size_t sVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  uVar1 = (this->super_Compiler).forwarded_temporaries._M_h._M_bucket_count;
  uVar5 = (ulong)expr % uVar1;
  p_Var6 = (this->super_Compiler).forwarded_temporaries._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(uint32_t *)&p_Var6->_M_nxt[1]._M_nxt != expr)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var2[1]._M_nxt == expr)) goto LAB_00200fd6;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00200fd6:
  if ((p_Var7 != (__node_base_ptr)0x0) && (p_Var7->_M_nxt != (_Hash_node_base *)0x0)) {
    pSVar3 = this->current_emitting_block;
    if (pSVar3 == (SPIRBlock *)0x0) {
      __assert_fail("current_emitting_block",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x2c31,
                    "void spirv_cross::CompilerGLSL::register_control_dependent_expression(uint32_t)"
                   );
    }
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::reserve
              (&pSVar3->invalidate_expressions,
               (pSVar3->invalidate_expressions).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size + 1);
    sVar4 = (pSVar3->invalidate_expressions).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    (pSVar3->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
    ptr[sVar4].id = expr;
    (pSVar3->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
    buffer_size = sVar4 + 1;
  }
  return;
}

Assistant:

void CompilerGLSL::register_control_dependent_expression(uint32_t expr)
{
	if (forwarded_temporaries.find(expr) == end(forwarded_temporaries))
		return;

	assert(current_emitting_block);
	current_emitting_block->invalidate_expressions.push_back(expr);
}